

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O0

string_t duckdb::CaseConvertOperatorASCII<true>::Operation<duckdb::string_t,duckdb::string_t>
                   (string_t input,Vector *result)

{
  char *input_length_00;
  char *in_RDX;
  undefined8 in_RDI;
  anon_union_16_2_67f50693_for_value aVar1;
  idx_t input_length;
  char *input_data;
  string_t *this;
  
  this = (string_t *)&stack0xffffffffffffffe0;
  input_length_00 = string_t::GetData(this);
  string_t::GetSize(this);
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       ASCIICaseConvert<true>((Vector *)in_RDI,in_RDX,(idx_t)input_length_00);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();
		return ASCIICaseConvert<IS_UPPER>(result, input_data, input_length);
	}